

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O1

void __thiscall
HighsPrimalHeuristics::RINS
          (HighsPrimalHeuristics *this,vector<double,_std::allocator<double>_> *relaxationsol)

{
  double *pdVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  int *piVar3;
  long lVar4;
  long lVar5;
  pointer pdVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  pointer piVar10;
  ulong uVar11;
  int64_t iVar12;
  pair<int,_double> *ppVar13;
  int *piVar14;
  pointer piVar15;
  char cVar16;
  int *piVar17;
  int __tmp;
  long lVar18;
  pair<int,_double> *ppVar19;
  HighsLpRelaxation *pHVar20;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  begin;
  size_t *psVar21;
  size_t sVar22;
  int iVar23;
  double dVar24;
  double dVar25;
  anon_class_16_2_405d1b53 comp;
  undefined1 in_stack_ffffffffffffa588;
  bool fixtolpsol;
  double local_5a68;
  double local_5a60;
  int local_5a54;
  HighsPrimalHeuristics *local_5a50;
  int local_5a44;
  double local_5a40;
  double local_5a38;
  double local_5a28;
  anon_class_32_4_ffb23deb getFixVal;
  HeuristicNeighbourhood neighbourhood;
  vector<double,_std::allocator<double>_> local_59a8;
  vector<double,_std::allocator<double>_> local_5990;
  HighsSearch heur;
  HighsPseudocost pscost;
  HighsLpRelaxation heurlp;
  
  _Var2._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if (*(bool *)((long)&(_Var2._M_head_impl)->domain + 0x280) != false) {
    return;
  }
  if ((long)(relaxationsol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(relaxationsol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)this->mipsolver->model_->num_col_) {
    return;
  }
  piVar14 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar18 = (long)piVar3 - (long)piVar14 >> 4;
  piVar17 = piVar14;
  if (0 < lVar18) {
    lVar4 = *(long *)&((vector<double,_std::allocator<double>_> *)
                      ((long)&(_Var2._M_head_impl)->domain + 0x308))->
                      super__Vector_base<double,_std::allocator<double>_>;
    lVar5 = *(long *)&((vector<double,_std::allocator<double>_> *)
                      ((long)&(_Var2._M_head_impl)->domain + 800))->
                      super__Vector_base<double,_std::allocator<double>_>;
    piVar17 = (int *)(((long)piVar3 - (long)piVar14 & 0xfffffffffffffff0U) + (long)piVar14);
    lVar18 = lVar18 + 1;
    piVar14 = piVar14 + 2;
    do {
      dVar25 = *(double *)(lVar4 + (long)piVar14[-2] * 8);
      pdVar1 = (double *)(lVar5 + (long)piVar14[-2] * 8);
      if ((dVar25 == *pdVar1) && (!NAN(dVar25) && !NAN(*pdVar1))) {
        piVar14 = piVar14 + -2;
        goto LAB_002dae51;
      }
      dVar25 = *(double *)(lVar4 + (long)piVar14[-1] * 8);
      pdVar1 = (double *)(lVar5 + (long)piVar14[-1] * 8);
      if ((dVar25 == *pdVar1) && (!NAN(dVar25) && !NAN(*pdVar1))) {
        piVar14 = piVar14 + -1;
        goto LAB_002dae51;
      }
      dVar25 = *(double *)(lVar4 + (long)*piVar14 * 8);
      pdVar1 = (double *)(lVar5 + (long)*piVar14 * 8);
      if ((dVar25 == *pdVar1) && (!NAN(dVar25) && !NAN(*pdVar1))) goto LAB_002dae51;
      dVar25 = *(double *)(lVar4 + (long)piVar14[1] * 8);
      pdVar1 = (double *)(lVar5 + (long)piVar14[1] * 8);
      if ((dVar25 == *pdVar1) && (!NAN(dVar25) && !NAN(*pdVar1))) {
        piVar14 = piVar14 + 1;
        goto LAB_002dae51;
      }
      lVar18 = lVar18 + -1;
      piVar14 = piVar14 + 4;
    } while (1 < lVar18);
  }
  lVar18 = (long)piVar3 - (long)piVar17 >> 2;
  if (lVar18 != 1) {
    piVar14 = piVar17;
    if (lVar18 != 2) {
      piVar14 = piVar3;
      if (lVar18 != 3) goto LAB_002dae51;
      dVar25 = *(double *)
                (*(long *)&((vector<double,_std::allocator<double>_> *)
                           ((long)&(_Var2._M_head_impl)->domain + 0x308))->
                           super__Vector_base<double,_std::allocator<double>_> + (long)*piVar17 * 8)
      ;
      pdVar1 = (double *)
               (*(long *)&((vector<double,_std::allocator<double>_> *)
                          ((long)&(_Var2._M_head_impl)->domain + 800))->
                          super__Vector_base<double,_std::allocator<double>_> + (long)*piVar17 * 8);
      if ((dVar25 == *pdVar1) && (piVar14 = piVar17, !NAN(dVar25) && !NAN(*pdVar1)))
      goto LAB_002dae51;
      piVar14 = piVar17 + 1;
    }
    dVar25 = *(double *)
              (*(long *)&((vector<double,_std::allocator<double>_> *)
                         ((long)&(_Var2._M_head_impl)->domain + 0x308))->
                         super__Vector_base<double,_std::allocator<double>_> + (long)*piVar14 * 8);
    pdVar1 = (double *)
             (*(long *)&((vector<double,_std::allocator<double>_> *)
                        ((long)&(_Var2._M_head_impl)->domain + 800))->
                        super__Vector_base<double,_std::allocator<double>_> + (long)*piVar14 * 8);
    if ((dVar25 == *pdVar1) && (!NAN(dVar25) && !NAN(*pdVar1))) goto LAB_002dae51;
    piVar17 = piVar14 + 1;
  }
  dVar25 = *(double *)
            (*(long *)&((vector<double,_std::allocator<double>_> *)
                       ((long)&(_Var2._M_head_impl)->domain + 0x308))->
                       super__Vector_base<double,_std::allocator<double>_> + (long)*piVar17 * 8);
  pdVar1 = (double *)
           (*(long *)&((vector<double,_std::allocator<double>_> *)
                      ((long)&(_Var2._M_head_impl)->domain + 800))->
                      super__Vector_base<double,_std::allocator<double>_> + (long)*piVar17 * 8);
  if ((dVar25 != *pdVar1) || (piVar14 = piVar17, NAN(dVar25) || NAN(*pdVar1))) {
    piVar14 = piVar3;
  }
LAB_002dae51:
  if ((piVar14 != piVar3) && (piVar17 = piVar14 + 1, piVar17 != piVar3)) {
    lVar18 = *(long *)&((vector<double,_std::allocator<double>_> *)
                       ((long)&(_Var2._M_head_impl)->domain + 0x308))->
                       super__Vector_base<double,_std::allocator<double>_>;
    lVar4 = *(long *)&((vector<double,_std::allocator<double>_> *)
                      ((long)&(_Var2._M_head_impl)->domain + 800))->
                      super__Vector_base<double,_std::allocator<double>_>;
    do {
      iVar23 = *piVar17;
      dVar25 = *(double *)(lVar18 + (long)iVar23 * 8);
      pdVar1 = (double *)(lVar4 + (long)iVar23 * 8);
      if ((dVar25 != *pdVar1) || (NAN(dVar25) || NAN(*pdVar1))) {
        *piVar14 = iVar23;
        piVar14 = piVar14 + 1;
      }
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar3);
  }
  if ((piVar14 != piVar3) &&
     (piVar10 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,
     piVar15 = (pointer)((long)piVar14 + ((long)piVar10 - (long)piVar3)), piVar10 != piVar15)) {
    (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar15;
  }
  HighsPseudocost::HighsPseudocost
            (&pscost,&((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->pseudocost
            );
  HighsSearch::HighsSearch(&heur,this->mipsolver,&pscost);
  heur.inheuristic = true;
  heur.childselrule = kHybridInferenceCost;
  HighsLpRelaxation::HighsLpRelaxation
            (&heurlp,&((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->lp);
  HighsLpRelaxation::setObjectiveLimit
            (&heurlp,((this->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit
            );
  heurlp.adjustSymBranchingCol = false;
  heur.lp = &heurlp;
  Highs::changeColsBounds
            (&heurlp.lpsolver,0,this->mipsolver->model_->num_col_ + -1,
             heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  for (piVar10 = heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      piVar10 !=
      heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish; piVar10 = piVar10 + 1) {
    heur.localdom.changedcolsflags_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[*piVar10] = '\0';
  }
  if (heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  HighsSearch::createNewNode(&heur);
  local_5a40 = determineTargetFixingRate(this);
  HeuristicNeighbourhood::HeuristicNeighbourhood(&neighbourhood,this->mipsolver,&heur.localdom);
  local_5a54 = -1;
  iVar23 = 1;
  local_5a50 = this;
  do {
    neighbourhood.nCheckedChanges = neighbourhood.startCheckedChanges;
    if (neighbourhood.fixedCols.numElements != 0) {
      HighsHashTable<int,_void>::clear(&neighbourhood.fixedCols);
    }
    local_5a54 = local_5a54 + 1;
    local_5a44 = iVar23;
    if ((iVar23 < (int)((ulong)((long)heur.nodestack.
                                      super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)heur.nodestack.
                                     super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555
                  + heur.depthoffset) &&
       (bVar8 = HighsSearch::backtrackUntilDepth(&heur,iVar23), !bVar8)) {
      lVar18 = HighsSearch::getLocalLpIterations(&heur);
LAB_002db9a6:
      psVar21 = &this->lp_iterations;
LAB_002db9aa:
      *psVar21 = *psVar21 + lVar18;
      break;
    }
    do {
      while (HighsSearch::evaluateNode(&heur),
            heur.nodestack.
            super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].opensubtrees == '\0') {
        if (*(bool *)((long)&((this->mipsolver->mipdata_)._M_t.
                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                             domain + 0x280) == true) {
          lVar18 = HighsSearch::getLocalLpIterations(&heur);
          goto LAB_002db9a6;
        }
        bVar8 = HighsSearch::backtrack(&heur,true);
        local_5a54 = local_5a54 + 1;
        if (!bVar8) goto LAB_002db727;
        neighbourhood.nCheckedChanges = neighbourhood.startCheckedChanges;
        if (neighbourhood.fixedCols.numElements != 0) {
          HighsHashTable<int,_void>::clear(&neighbourhood.fixedCols);
        }
      }
      local_5a68 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
      if ((local_5a40 <= local_5a68) || (9 < local_5a54)) break;
      begin._M_current =
           heurlp.fractionalints.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      if (heurlp.fractionalints.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          heurlp.fractionalints.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pdVar6 = (relaxationsol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        _Var2._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        lVar18 = *(long *)&((_Var2._M_head_impl)->incumbent).
                           super__Vector_base<double,_std::allocator<double>_>;
        ppVar13 = heurlp.fractionalints.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppVar19 = heurlp.fractionalints.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          dVar25 = (_Var2._M_head_impl)->feastol;
          begin._M_current = ppVar19;
          while (iVar23 = (begin._M_current)->first,
                ABS(pdVar6[iVar23] - *(double *)(lVar18 + (long)iVar23 * 8)) <= dVar25) {
            begin._M_current = begin._M_current + 1;
            if (begin._M_current == ppVar13) goto LAB_002db17a;
          }
          do {
            ppVar19 = ppVar13;
            ppVar13 = ppVar19 + -1;
            if (ppVar13 == begin._M_current) goto LAB_002db17a;
            iVar9 = ppVar13->first;
          } while (dVar25 < ABS(pdVar6[iVar9] - *(double *)(lVar18 + (long)iVar9 * 8)));
          (begin._M_current)->first = iVar9;
          ppVar13->first = iVar23;
          dVar25 = (begin._M_current)->second;
          (begin._M_current)->second = ppVar19[-1].second;
          ppVar19[-1].second = dVar25;
          ppVar19 = begin._M_current + 1;
        } while (ppVar13 != ppVar19);
        begin._M_current = begin._M_current + 1;
      }
LAB_002db17a:
      fixtolpsol = true;
      getFixVal.fixtolpsol = &fixtolpsol;
      getFixVal.localdom = &heur.localdom;
      getFixVal.relaxationsol = relaxationsol;
      getFixVal.this = this;
      if (heurlp.fractionalints.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start == begin._M_current) {
        local_5a68 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
        piVar14 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar3 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar14 == piVar3) {
          iVar23 = 0;
        }
        else {
          local_5a60 = (1.0 - local_5a68) * -0.9 + 1.0;
          if (local_5a40 <= local_5a60) {
            local_5a60 = local_5a40;
          }
          iVar23 = 0;
          do {
            iVar9 = *piVar14;
            lVar18 = (long)iVar9;
            dVar25 = heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar18];
            cVar16 = '\x06';
            if ((dVar25 != heur.localdom.col_upper_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar18]) ||
               (NAN(dVar25) ||
                NAN(heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar18]))) {
              dVar24 = heurlp.lpsolver.solution_.col_value.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18];
              _Var2._M_head_impl =
                   (local_5a50->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              cVar16 = '\0';
              if (ABS(dVar24 - *(double *)
                                (*(long *)&((_Var2._M_head_impl)->incumbent).
                                           super__Vector_base<double,_std::allocator<double>_> +
                                lVar18 * 8)) <= (_Var2._M_head_impl)->feastol) {
                dVar24 = (double)(long)((double)((ulong)dVar24 & 0x8000000000000000 |
                                                0x3fe0000000000000) + dVar24);
                if (dVar25 < dVar24) {
                  local_5a38 = dVar24;
                  HighsSearch::branchUpwards(&heur,iVar9,dVar24,dVar24 + -0.5);
                  HighsDomain::propagate(&heur.localdom);
                  iVar23 = iVar23 + 1;
                  if (heur.localdom.infeasible_ == true) {
                    cVar16 = '\x05';
                    HighsDomain::conflictAnalysis
                              (&heur.localdom,
                               &((local_5a50->mipsolver->mipdata_)._M_t.
                                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                                conflictPool);
                    goto LAB_002db3c5;
                  }
                  local_5a68 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
                  dVar24 = local_5a38;
                }
                if (dVar24 < heur.localdom.col_upper_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar18]) {
                  HighsSearch::branchDownwards(&heur,iVar9,dVar24,dVar24 + 0.5);
                  HighsDomain::propagate(&heur.localdom);
                  iVar23 = iVar23 + 1;
                  if (heur.localdom.infeasible_ == true) {
                    cVar16 = '\x05';
                    HighsDomain::conflictAnalysis
                              (&heur.localdom,
                               &((local_5a50->mipsolver->mipdata_)._M_t.
                                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                                conflictPool);
                    goto LAB_002db3c5;
                  }
                  local_5a68 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
                }
                cVar16 = (local_5a60 <= local_5a68) * '\x05';
              }
            }
LAB_002db3c5:
          } while (((cVar16 == '\x06') || (cVar16 == '\0')) &&
                  (piVar14 = piVar14 + 1, piVar14 != piVar3));
        }
        if (iVar23 == 0) {
          iVar9 = 0;
          if (0.25 <= local_5a68) {
            iVar9 = 4;
            bVar8 = false;
          }
          else {
            fixtolpsol = false;
            bVar8 = true;
            begin._M_current =
                 heurlp.fractionalints.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        else {
          bVar8 = false;
          HighsLpRelaxation::flushDomain(&heurlp,&heur.localdom,false);
          iVar9 = 3;
        }
        this = local_5a50;
        if (bVar8) goto LAB_002db443;
      }
      else {
        iVar23 = 0;
LAB_002db443:
        if (heurlp.fractionalints.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != begin._M_current) {
          uVar11 = (long)begin._M_current -
                   (long)heurlp.fractionalints.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          pHVar20 = (HighsLpRelaxation *)0x0;
          if (1 < uVar11) {
            pHVar20 = (HighsLpRelaxation *)0x0;
            do {
              uVar11 = (long)uVar11 >> 1;
              pHVar20 = (HighsLpRelaxation *)(ulong)((int)pHVar20 + 1);
            } while (1 < uVar11);
          }
          comp.heurlp = pHVar20;
          comp.getFixVal = (anon_class_32_4_ffb23deb *)&heurlp;
          pdqsort_detail::
          pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
                    ((pdqsort_detail *)
                     heurlp.fractionalints.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,begin,(pair<int,_double> *)&getFixVal
                     ,comp,1,(bool)in_stack_ffffffffffffa588);
        }
        if (heurlp.fractionalints.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != begin._M_current) {
          local_5a28 = 0.0;
          ppVar19 = heurlp.fractionalints.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            ppVar13 = ppVar19 + 1;
            iVar9 = ppVar19->first;
            local_5a60 = ppVar19->second;
            if (*getFixVal.fixtolpsol == true) {
              dVar24 = ((getFixVal.relaxationsol)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar9];
LAB_002db4d3:
              dVar24 = dVar24 + 0.5;
LAB_002db4db:
              dVar25 = floor(dVar24);
            }
            else {
              dVar25 = ((getFixVal.this)->mipsolver->model_->col_cost_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar9];
              if (dVar25 <= 0.0) {
                dVar24 = local_5a60;
                if (0.0 <= dVar25) goto LAB_002db4d3;
                goto LAB_002db4db;
              }
              dVar25 = ceil(local_5a60);
            }
            dVar24 = ((getFixVal.localdom)->col_upper_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9];
            if (dVar24 <= dVar25) {
              dVar25 = dVar24;
            }
            dVar24 = ((getFixVal.localdom)->col_lower_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9];
            if (dVar25 <= dVar24) {
              dVar25 = dVar24;
            }
            if (dVar25 < heur.localdom.col_lower_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar9] ||
                dVar25 == heur.localdom.col_lower_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar9]) {
LAB_002db5ba:
              if (dVar25 < heur.localdom.col_upper_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[ppVar19->first]) {
                local_5a38 = dVar25;
                HighsSearch::branchDownwards(&heur,ppVar19->first,dVar25,ppVar19->second);
                iVar23 = iVar23 + 1;
                if (heur.localdom.infeasible_ == true) {
                  bVar8 = true;
                  HighsDomain::conflictAnalysis
                            (&heur.localdom,
                             &((this->mipsolver->mipdata_)._M_t.
                               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                              conflictPool);
                  goto LAB_002db66f;
                }
                local_5a68 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
                dVar25 = local_5a38;
              }
              bVar8 = true;
              if (local_5a68 < local_5a40) {
                local_5a28 = local_5a28 + ABS(dVar25 - ppVar19->second);
                bVar8 = 0.5 <= local_5a28;
              }
            }
            else {
              local_5a38 = dVar25;
              HighsSearch::branchUpwards(&heur,iVar9,dVar25,local_5a60);
              iVar23 = iVar23 + 1;
              if (heur.localdom.infeasible_ != true) {
                local_5a68 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
                dVar25 = local_5a38;
                goto LAB_002db5ba;
              }
              bVar8 = true;
              HighsDomain::conflictAnalysis
                        (&heur.localdom,
                         &((this->mipsolver->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                          conflictPool);
            }
LAB_002db66f:
          } while ((!bVar8) && (ppVar19 = ppVar13, ppVar13 != begin._M_current));
        }
        if (iVar23 == 0) {
          iVar9 = 4;
        }
        else {
          iVar9 = 0;
          HighsLpRelaxation::flushDomain(&heurlp,&heur.localdom,false);
        }
      }
      iVar23 = local_5a44;
    } while (iVar9 != 4);
LAB_002db727:
    if (heur.nodestack.
        super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
        super__Vector_impl_data._M_start ==
        heur.nodestack.
        super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar18 = HighsSearch::getLocalLpIterations(&heur);
      goto LAB_002db9a6;
    }
    local_5a60 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    if ((local_5a60 < 0.1) ||
       ((this->mipsolver->submip == true &&
        (((this->mipsolver->mipdata_)._M_t.
          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
          super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->numImprovingSols != 0)))
       ) {
      HighsSearch::setMinReliable(&heur,0);
      HighsSearch::solveDepthFirst(&heur,10);
      iVar12 = HighsSearch::getLocalLpIterations(&heur);
      this->lp_iterations = this->lp_iterations + iVar12;
      if (this->mipsolver->submip == true) {
        lVar18 = HighsSearch::getLocalNodes(&heur);
        psVar21 = (size_t *)
                  &((this->mipsolver->mipdata_)._M_t.
                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->num_nodes;
        goto LAB_002db9aa;
      }
      break;
    }
    HighsLpRelaxation::removeObsoleteRows(&heurlp,false);
    std::vector<double,_std::allocator<double>_>::vector(&local_5990,&heur.localdom.col_lower_);
    std::vector<double,_std::allocator<double>_>::vector(&local_59a8,&heur.localdom.col_upper_);
    auVar7 = SEXT816(0x6666666666666667) *
             SEXT816(((this->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->num_nodes);
    bVar8 = solveSubMip(this,&heurlp.lpsolver.model_.lp_,&heurlp.lpsolver.basis_,local_5a60,
                        &local_5990,&local_59a8,500,
                        ((int)(auVar7._8_8_ >> 3) - (auVar7._12_4_ >> 0x1f)) + 200,0xc);
    if (local_59a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_59a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_5990.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5990.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (bVar8) {
      iVar12 = HighsSearch::getLocalLpIterations(&heur);
      this->lp_iterations = this->lp_iterations + iVar12;
LAB_002db8f5:
      bVar8 = false;
    }
    else {
      sVar22 = this->lp_iterations;
      iVar12 = HighsSearch::getLocalLpIterations(&heur);
      sVar22 = iVar12 + sVar22;
      _Var2._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if (((_Var2._M_head_impl)->total_lp_iterations -
           ((_Var2._M_head_impl)->heuristic_lp_iterations + (_Var2._M_head_impl)->sb_lp_iterations)
          >> 1) + 100000 < (long)((_Var2._M_head_impl)->heuristic_lp_iterations + sVar22)) {
        this->lp_iterations = sVar22;
        bVar8 = false;
        iVar23 = local_5a44;
      }
      else {
        iVar9 = (int)((ulong)((long)heur.nodestack.
                                    super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)heur.nodestack.
                                   super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555 +
                heur.depthoffset;
        iVar23 = iVar9 / 2;
        if ((iVar9 < 4) || (bVar8 = HighsMipSolverData::checkLimits(_Var2._M_head_impl,0), bVar8)) {
          this->lp_iterations = sVar22;
          goto LAB_002db8f5;
        }
        local_5a40 = local_5a60 * 0.5;
        bVar8 = true;
      }
    }
  } while (bVar8);
  HighsHashTable<int,_void>::~HighsHashTable(&neighbourhood.fixedCols);
  HighsLpRelaxation::~HighsLpRelaxation(&heurlp);
  HighsHashTable<int,_int>::~HighsHashTable(&heur.reliableatnode);
  std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::~vector
            (&heur.nodestack);
  if (heur.subrootsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(heur.subrootsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (heur.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(heur.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (heur.inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(heur.inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsDomain::~HighsDomain(&heur.localdom);
  HighsPseudocost::~HighsPseudocost(&pscost);
  return;
}

Assistant:

void HighsPrimalHeuristics::RINS(const std::vector<double>& relaxationsol) {
  // return if domain is infeasible
  if (mipsolver.mipdata_->domain.infeasible()) return;

  if (relaxationsol.size() != static_cast<size_t>(mipsolver.numCol())) return;

  intcols.erase(std::remove_if(intcols.begin(), intcols.end(),
                               [&](HighsInt i) {
                                 return mipsolver.mipdata_->domain.isFixed(i);
                               }),
                intcols.end());

  HighsPseudocost pscost(mipsolver.mipdata_->pseudocost);
  HighsSearch heur(mipsolver, pscost);
  HighsDomain& localdom = heur.getLocalDomain();
  heur.setHeuristic(true);

  HighsLpRelaxation heurlp(mipsolver.mipdata_->lp);
  // only use the global upper limit as LP limit so that dual proofs are valid
  heurlp.setObjectiveLimit(mipsolver.mipdata_->upper_limit);
  heurlp.setAdjustSymmetricBranchingCol(false);
  heur.setLpRelaxation(&heurlp);

  heurlp.getLpSolver().changeColsBounds(0, mipsolver.numCol() - 1,
                                        localdom.col_lower_.data(),
                                        localdom.col_upper_.data());
  localdom.clearChangedCols();
  heur.createNewNode();

  // determine the initial number of unfixed variables fixing rate to decide if
  // the problem is restricted enough to be considered for solving a submip
  double maxfixingrate = determineTargetFixingRate();
  double minfixingrate = 0.25;
  double fixingrate = 0.0;
  bool stop = false;
  HighsInt nbacktracks = -1;
  HighsInt targetdepth = 1;
  HeuristicNeighbourhood neighbourhood(mipsolver, localdom);
retry:
  ++nbacktracks;
  neighbourhood.backtracked();
  // printf("current depth : %" HIGHSINT_FORMAT "   target depth : %"
  // HIGHSINT_FORMAT "\n", heur.getCurrentDepth(),
  //       targetdepth);
  if (heur.getCurrentDepth() > targetdepth) {
    if (!heur.backtrackUntilDepth(targetdepth)) {
      lp_iterations += heur.getLocalLpIterations();
      return;
    }
  }

  assert(heur.hasNode());

  while (true) {
    heur.evaluateNode();
    if (heur.currentNodePruned()) {
      ++nbacktracks;
      // printf("backtrack1\n");
      if (mipsolver.mipdata_->domain.infeasible()) {
        lp_iterations += heur.getLocalLpIterations();
        return;
      }

      if (!heur.backtrack()) break;
      neighbourhood.backtracked();
      continue;
    }

    fixingrate = neighbourhood.getFixingRate();

    if (stop) break;
    if (fixingrate >= maxfixingrate) break;
    if (nbacktracks >= 10) break;

    std::vector<std::pair<HighsInt, double>>::iterator fixcandend;

    // partition the fractional variables to consider which ones should we fix
    // in this dive first if there is an incumbent, we dive towards the RINS
    // neighbourhood
    fixcandend = std::partition(
        heurlp.getFractionalIntegers().begin(),
        heurlp.getFractionalIntegers().end(),
        [&](const std::pair<HighsInt, double>& fracvar) {
          return std::abs(relaxationsol[fracvar.first] -
                          mipsolver.mipdata_->incumbent[fracvar.first]) <=
                 mipsolver.mipdata_->feastol;
        });

    bool fixtolpsol = true;

    auto getFixVal = [&](HighsInt col, double fracval) {
      double fixval;
      if (fixtolpsol) {
        // RINS neighbourhood (with extension)
        fixval = std::floor(relaxationsol[col] + 0.5);
      } else {
        // reinforce direction of this solution away from root
        // solution if the change is at least 0.4
        // otherwise take the direction where the objective gets worse
        // if objective is zero round to nearest integer
        double rootchange = fracval - mipsolver.mipdata_->rootlpsol[col];
        if (rootchange >= 0.4)
          fixval = std::ceil(fracval);
        else if (rootchange <= -0.4)
          fixval = std::floor(fracval);
        if (mipsolver.model_->col_cost_[col] > 0.0)
          fixval = std::ceil(fracval);
        else if (mipsolver.model_->col_cost_[col] < 0.0)
          fixval = std::floor(fracval);
        else
          fixval = std::floor(fracval + 0.5);
      }
      // make sure we do not set an infeasible domain
      fixval = std::min(localdom.col_upper_[col], fixval);
      fixval = std::max(localdom.col_lower_[col], fixval);
      return fixval;
    };

    // no candidates left to fix for getting to the neighbourhood, therefore we
    // switch to a different diving strategy until the minimal fixing rate is
    // reached
    HighsInt numBranched = 0;
    if (heurlp.getFractionalIntegers().begin() == fixcandend) {
      fixingrate = neighbourhood.getFixingRate();
      double stopFixingRate =
          std::min(maxfixingrate, 1.0 - (1.0 - fixingrate) * 0.9);
      const auto& currlpsol = heurlp.getSolution().col_value;
      for (HighsInt i : intcols) {
        if (localdom.col_lower_[i] == localdom.col_upper_[i]) continue;

        if (std::abs(currlpsol[i] - mipsolver.mipdata_->incumbent[i]) <=
            mipsolver.mipdata_->feastol) {
          double fixval = HighsIntegers::nearestInteger(currlpsol[i]);
          if (localdom.col_lower_[i] < fixval) {
            ++numBranched;
            heur.branchUpwards(i, fixval, fixval - 0.5);
            localdom.propagate();
            if (localdom.infeasible()) {
              localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
              break;
            }

            fixingrate = neighbourhood.getFixingRate();
          }
          if (localdom.col_upper_[i] > fixval) {
            ++numBranched;
            heur.branchDownwards(i, fixval, fixval + 0.5);
            localdom.propagate();
            if (localdom.infeasible()) {
              localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
              break;
            }

            fixingrate = neighbourhood.getFixingRate();
          }

          if (fixingrate >= stopFixingRate) break;
        }
      }

      if (numBranched != 0) {
        // printf(
        //    "fixed %" HIGHSINT_FORMAT " additional cols, old fixing rate:
        //    %.2f%%, new fixing " "rate: %.2f%%\n", numBranched, fixingrate,
        //    getFixingRate());
        heurlp.flushDomain(localdom);
        continue;
      }

      if (fixingrate >= minfixingrate)
        break;  // if the RINS neighbourhood achieved a high enough fixing rate
                // by itself we stop here
      fixcandend = heurlp.getFractionalIntegers().end();
      // now sort the variables by their distance towards the value they will
      // be fixed to
      fixtolpsol = false;
    }

    // now sort the variables by their distance towards the value they will be
    // fixed to
    pdqsort(heurlp.getFractionalIntegers().begin(), fixcandend,
            [&](const std::pair<HighsInt, double>& a,
                const std::pair<HighsInt, double>& b) {
              return std::make_pair(
                         std::abs(getFixVal(a.first, a.second) - a.second),
                         HighsHashHelpers::hash(
                             (uint64_t(a.first) << 32) +
                             heurlp.getFractionalIntegers().size())) <
                     std::make_pair(
                         std::abs(getFixVal(b.first, b.second) - b.second),
                         HighsHashHelpers::hash(
                             (uint64_t(b.first) << 32) +
                             heurlp.getFractionalIntegers().size()));
            });

    double change = 0.0;
    // select a set of fractional variables to fix
    for (auto fracint = heurlp.getFractionalIntegers().begin();
         fracint != fixcandend; ++fracint) {
      double fixval = getFixVal(fracint->first, fracint->second);

      if (localdom.col_lower_[fracint->first] < fixval) {
        ++numBranched;
        heur.branchUpwards(fracint->first, fixval, fracint->second);
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          break;
        }

        fixingrate = neighbourhood.getFixingRate();
      }

      if (localdom.col_upper_[fracint->first] > fixval) {
        ++numBranched;
        heur.branchDownwards(fracint->first, fixval, fracint->second);
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          break;
        }

        fixingrate = neighbourhood.getFixingRate();
      }

      if (fixingrate >= maxfixingrate) break;

      change += std::abs(fixval - fracint->second);
      if (change >= 0.5) break;
    }

    if (numBranched == 0) break;

    heurlp.flushDomain(localdom);

    // printf("%" HIGHSINT_FORMAT "/%" HIGHSINT_FORMAT " fixed, fixingrate is
    // %g\n", nfixed, ntotal, fixingrate);
  }

  // if there is no node left it means we backtracked to the global domain and
  // the subproblem was solved with the dive
  if (!heur.hasNode()) {
    lp_iterations += heur.getLocalLpIterations();
    return;
  }
  // determine the fixing rate to decide if the problem is restricted enough
  // to be considered for solving a submip

  // printf("fixing rate is %g\n", fixingrate);
  fixingrate = neighbourhood.getFixingRate();
  if (fixingrate < 0.1 ||
      (mipsolver.submip && mipsolver.mipdata_->numImprovingSols != 0)) {
    // heur.childselrule = ChildSelectionRule::kBestCost;
    heur.setMinReliable(0);
    heur.solveDepthFirst(10);
    lp_iterations += heur.getLocalLpIterations();
    if (mipsolver.submip) mipsolver.mipdata_->num_nodes += heur.getLocalNodes();
    // lpiterations += heur.lpiterations;
    // pseudocost = heur.pseudocost;
    return;
  }

  heurlp.removeObsoleteRows(false);
  const bool solve_sub_mip_return =
      solveSubMip(heurlp.getLp(), heurlp.getLpSolver().getBasis(), fixingrate,
                  localdom.col_lower_, localdom.col_upper_,
                  500,  // std::max(50, int(0.05 *
                  // (mipsolver.mipdata_->num_leaves))),
                  200 + mipsolver.mipdata_->num_nodes / 20, 12);
  if (!solve_sub_mip_return) {
    int64_t new_lp_iterations = lp_iterations + heur.getLocalLpIterations();
    if (new_lp_iterations + mipsolver.mipdata_->heuristic_lp_iterations >
        100000 + ((mipsolver.mipdata_->total_lp_iterations -
                   mipsolver.mipdata_->heuristic_lp_iterations -
                   mipsolver.mipdata_->sb_lp_iterations) >>
                  1)) {
      lp_iterations = new_lp_iterations;
      return;
    }

    targetdepth = heur.getCurrentDepth() / 2;
    if (targetdepth <= 1 || mipsolver.mipdata_->checkLimits()) {
      lp_iterations = new_lp_iterations;
      return;
    }
    // printf("infeasible in root node, trying with lower fixing rate\n");
    maxfixingrate = fixingrate * 0.5;
    goto retry;
  }

  lp_iterations += heur.getLocalLpIterations();
}